

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestSpec::NamePattern::matches(NamePattern *this,TestCaseInfo *testCase)

{
  logic_error *this_00;
  Catch local_b0 [32];
  Catch local_90 [48];
  Catch local_60 [32];
  Catch local_40 [32];
  TestCaseInfo *local_20;
  TestCaseInfo *testCase_local;
  NamePattern *this_local;
  
  local_20 = testCase;
  testCase_local = (TestCaseInfo *)this;
  switch(this->m_wildcard) {
  case NoWildcard:
    toLower(local_40,&testCase->name);
    this_local._7_1_ =
         std::operator==(&this->m_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
    std::__cxx11::string::~string((string *)local_40);
    break;
  case WildcardAtStart:
    toLower(local_60,&testCase->name);
    this_local._7_1_ = endsWith((string *)local_60,&this->m_name);
    std::__cxx11::string::~string((string *)local_60);
    break;
  case WildcardAtEnd:
    toLower(local_90,&testCase->name);
    this_local._7_1_ = startsWith((string *)local_90,&this->m_name);
    std::__cxx11::string::~string((string *)local_90);
    break;
  case WildcardAtBothEnds:
    toLower(local_b0,&testCase->name);
    this_local._7_1_ = contains((string *)local_b0,&this->m_name);
    std::__cxx11::string::~string((string *)local_b0);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown enum");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

virtual bool matches( TestCaseInfo const& testCase ) const {
                switch( m_wildcard ) {
                    case NoWildcard:
                        return m_name == toLower( testCase.name );
                    case WildcardAtStart:
                        return endsWith( toLower( testCase.name ), m_name );
                    case WildcardAtEnd:
                        return startsWith( toLower( testCase.name ), m_name );
                    case WildcardAtBothEnds:
                        return contains( toLower( testCase.name ), m_name );
                }

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wunreachable-code"
#endif
                throw std::logic_error( "Unknown enum" );
#ifdef __clang__
#pragma clang diagnostic pop
#endif
            }